

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundShape.cpp
# Opt level: O1

void __thiscall
btCompoundShape::addChildShape
          (btCompoundShape *this,btTransform *localTransform,btCollisionShape *shape)

{
  int *piVar1;
  undefined8 *puVar2;
  btScalar *pbVar3;
  undefined8 *puVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  btCompoundShapeChild *pbVar9;
  undefined8 uVar10;
  int i;
  long lVar11;
  btDbvtNode *pbVar12;
  btCompoundShapeChild *pbVar13;
  long lVar14;
  int iVar15;
  btScalar extraout_XMM0_Da;
  btVector3 localAabbMax;
  btVector3 localAabbMin;
  btDbvtVolume bounds;
  btScalar local_b8 [4];
  btScalar local_a8 [4];
  btDbvtVolume local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  btScalar local_48;
  btScalar bStack_44;
  btScalar bStack_40;
  btScalar bStack_3c;
  
  this->m_updateRevision = this->m_updateRevision + 1;
  local_78 = *(undefined8 *)(localTransform->m_basis).m_el[0].m_floats;
  uStack_70 = *(undefined8 *)((localTransform->m_basis).m_el[0].m_floats + 2);
  local_68 = *(undefined8 *)(localTransform->m_basis).m_el[1].m_floats;
  uStack_60 = *(undefined8 *)((localTransform->m_basis).m_el[1].m_floats + 2);
  local_58 = *(undefined8 *)(localTransform->m_basis).m_el[2].m_floats;
  uStack_50 = *(undefined8 *)((localTransform->m_basis).m_el[2].m_floats + 2);
  local_48 = (localTransform->m_origin).m_floats[0];
  bStack_44 = (localTransform->m_origin).m_floats[1];
  bStack_40 = (localTransform->m_origin).m_floats[2];
  bStack_3c = (localTransform->m_origin).m_floats[3];
  iVar6 = shape->m_shapeType;
  (*shape->_vptr_btCollisionShape[0xc])(shape);
  (*shape->_vptr_btCollisionShape[2])(shape,localTransform,local_a8,local_b8);
  lVar11 = 0;
  do {
    if (local_a8[lVar11] < (this->m_localAabbMin).m_floats[lVar11]) {
      (this->m_localAabbMin).m_floats[lVar11] = local_a8[lVar11];
    }
    fVar5 = local_b8[lVar11];
    pbVar3 = (this->m_localAabbMax).m_floats + lVar11;
    if (*pbVar3 <= fVar5 && fVar5 != *pbVar3) {
      (this->m_localAabbMax).m_floats[lVar11] = fVar5;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  if (this->m_dynamicAabbTree == (btDbvt *)0x0) {
    pbVar12 = (btDbvtNode *)0x0;
  }
  else {
    local_98.mi.m_floats[0] = local_a8[0];
    local_98.mi.m_floats[1] = local_a8[1];
    local_98.mi.m_floats[2] = local_a8[2];
    local_98.mi.m_floats[3] = local_a8[3];
    local_98.mx.m_floats[0] = local_b8[0];
    local_98.mx.m_floats[1] = local_b8[1];
    local_98.mx.m_floats[2] = local_b8[2];
    local_98.mx.m_floats[3] = local_b8[3];
    pbVar12 = btDbvt::insert(this->m_dynamicAabbTree,&local_98,
                             (void *)(long)(this->m_children).m_size);
  }
  iVar7 = (this->m_children).m_size;
  iVar8 = (this->m_children).m_capacity;
  if (iVar7 == iVar8) {
    iVar15 = 1;
    if (iVar7 != 0) {
      iVar15 = iVar7 * 2;
    }
    if (iVar8 < iVar15) {
      if (iVar15 == 0) {
        pbVar13 = (btCompoundShapeChild *)0x0;
      }
      else {
        pbVar13 = (btCompoundShapeChild *)btAlignedAllocInternal((long)iVar15 * 0x58,0x10);
      }
      lVar11 = (long)(this->m_children).m_size;
      if (0 < lVar11) {
        lVar14 = 0;
        do {
          pbVar9 = (this->m_children).m_data;
          puVar2 = (undefined8 *)((long)(pbVar9->m_transform).m_basis.m_el[0].m_floats + lVar14);
          uVar10 = puVar2[1];
          puVar4 = (undefined8 *)((long)(pbVar13->m_transform).m_basis.m_el[0].m_floats + lVar14);
          *puVar4 = *puVar2;
          puVar4[1] = uVar10;
          puVar2 = (undefined8 *)((long)(pbVar9->m_transform).m_basis.m_el[1].m_floats + lVar14);
          uVar10 = puVar2[1];
          puVar4 = (undefined8 *)((long)(pbVar13->m_transform).m_basis.m_el[1].m_floats + lVar14);
          *puVar4 = *puVar2;
          puVar4[1] = uVar10;
          puVar2 = (undefined8 *)((long)(pbVar9->m_transform).m_basis.m_el[2].m_floats + lVar14);
          uVar10 = puVar2[1];
          puVar4 = (undefined8 *)((long)(pbVar13->m_transform).m_basis.m_el[2].m_floats + lVar14);
          *puVar4 = *puVar2;
          puVar4[1] = uVar10;
          puVar2 = (undefined8 *)((long)(pbVar9->m_transform).m_origin.m_floats + lVar14);
          uVar10 = puVar2[1];
          puVar4 = (undefined8 *)((long)(pbVar13->m_transform).m_origin.m_floats + lVar14);
          *puVar4 = *puVar2;
          puVar4[1] = uVar10;
          *(undefined8 *)((long)(&pbVar13->m_transform + 1) + lVar14 + 0x10) =
               *(undefined8 *)((long)(&pbVar9->m_transform + 1) + lVar14 + 0x10);
          puVar4 = (undefined8 *)((long)(&pbVar9->m_transform + 1) + lVar14);
          uVar10 = puVar4[1];
          puVar2 = (undefined8 *)((long)(&pbVar13->m_transform + 1) + lVar14);
          *puVar2 = *puVar4;
          puVar2[1] = uVar10;
          lVar14 = lVar14 + 0x58;
        } while (lVar11 * 0x58 - lVar14 != 0);
      }
      pbVar9 = (this->m_children).m_data;
      if (pbVar9 != (btCompoundShapeChild *)0x0) {
        if ((this->m_children).m_ownsMemory == true) {
          btAlignedFreeInternal(pbVar9);
        }
        (this->m_children).m_data = (btCompoundShapeChild *)0x0;
      }
      (this->m_children).m_ownsMemory = true;
      (this->m_children).m_data = pbVar13;
      (this->m_children).m_capacity = iVar15;
    }
  }
  pbVar13 = (this->m_children).m_data;
  iVar7 = (this->m_children).m_size;
  *(undefined8 *)pbVar13[iVar7].m_transform.m_basis.m_el[0].m_floats = local_78;
  *(undefined8 *)(pbVar13[iVar7].m_transform.m_basis.m_el[0].m_floats + 2) = uStack_70;
  *(undefined8 *)pbVar13[iVar7].m_transform.m_basis.m_el[1].m_floats = local_68;
  *(undefined8 *)(pbVar13[iVar7].m_transform.m_basis.m_el[1].m_floats + 2) = uStack_60;
  *(undefined8 *)pbVar13[iVar7].m_transform.m_basis.m_el[2].m_floats = local_58;
  *(undefined8 *)(pbVar13[iVar7].m_transform.m_basis.m_el[2].m_floats + 2) = uStack_50;
  *(ulong *)pbVar13[iVar7].m_transform.m_origin.m_floats = CONCAT44(bStack_44,local_48);
  *(ulong *)(pbVar13[iVar7].m_transform.m_origin.m_floats + 2) = CONCAT44(bStack_3c,bStack_40);
  pbVar13[iVar7].m_childShape = shape;
  pbVar13[iVar7].m_childShapeType = iVar6;
  pbVar13[iVar7].m_childMargin = extraout_XMM0_Da;
  pbVar13[iVar7].m_node = pbVar12;
  piVar1 = &(this->m_children).m_size;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void	btCompoundShape::addChildShape(const btTransform& localTransform,btCollisionShape* shape)
{
	m_updateRevision++;
	//m_childTransforms.push_back(localTransform);
	//m_childShapes.push_back(shape);
	btCompoundShapeChild child;
	child.m_node = 0;
	child.m_transform = localTransform;
	child.m_childShape = shape;
	child.m_childShapeType = shape->getShapeType();
	child.m_childMargin = shape->getMargin();

	
	//extend the local aabbMin/aabbMax
	btVector3 localAabbMin,localAabbMax;
	shape->getAabb(localTransform,localAabbMin,localAabbMax);
	for (int i=0;i<3;i++)
	{
		if (m_localAabbMin[i] > localAabbMin[i])
		{
			m_localAabbMin[i] = localAabbMin[i];
		}
		if (m_localAabbMax[i] < localAabbMax[i])
		{
			m_localAabbMax[i] = localAabbMax[i];
		}

	}
	if (m_dynamicAabbTree)
	{
		const btDbvtVolume	bounds=btDbvtVolume::FromMM(localAabbMin,localAabbMax);
		size_t index = m_children.size();
		child.m_node = m_dynamicAabbTree->insert(bounds,reinterpret_cast<void*>(index) );
	}

	m_children.push_back(child);

}